

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteFuncLocals
          (BinaryWriter *this,Func *func,LocalTypes *param_2)

{
  Type type;
  bool bVar1;
  Index IVar2;
  Decls *pDVar3;
  size_type sVar4;
  reference ppVar5;
  pair<wabt::Type,_unsigned_int> decl;
  const_iterator __end2;
  const_iterator __begin2;
  Decls *__range2;
  Index local_decl_count;
  LocalTypes *local_types_local;
  Func *func_local;
  BinaryWriter *this_local;
  
  IVar2 = LocalTypes::size(param_2);
  if (IVar2 == 0) {
    WriteU32Leb128<int>(this->stream_,0,"local decl count");
  }
  else {
    pDVar3 = LocalTypes::decls(param_2);
    sVar4 = std::
            vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
            ::size(pDVar3);
    WriteU32Leb128(this->stream_,(uint32_t)sVar4,"local decl count");
    pDVar3 = LocalTypes::decls(param_2);
    __end2 = std::
             vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
             ::begin(pDVar3);
    decl._4_8_ = std::
                 vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                 ::end(pDVar3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
                                       *)&decl.first.type_index_), bVar1) {
      ppVar5 = __gnu_cxx::
               __normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
               ::operator*(&__end2);
      type = ppVar5->first;
      decl.first.enum_ = ppVar5->second;
      WriteU32Leb128(this->stream_,decl.first.enum_,"local type count");
      WriteType(this->stream_,type,(char *)0x0);
      __gnu_cxx::
      __normal_iterator<const_std::pair<wabt::Type,_unsigned_int>_*,_std::vector<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void BinaryWriter::WriteFuncLocals(const Func* func,
                                   const LocalTypes& local_types) {
  if (local_types.size() == 0) {
    WriteU32Leb128(stream_, 0, "local decl count");
    return;
  }

  Index local_decl_count = local_types.decls().size();
  WriteU32Leb128(stream_, local_decl_count, "local decl count");
  for (auto decl : local_types.decls()) {
    WriteU32Leb128(stream_, decl.second, "local type count");
    WriteType(stream_, decl.first);
  }
}